

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

us_socket_t * us_socket_close(int ssl,us_socket_t *s)

{
  us_socket_context_t *puVar1;
  us_loop_t *puVar2;
  int __fd;
  us_internal_ssl_socket_t *puVar3;
  us_socket_t *puVar4;
  
  if (ssl != 0) {
    puVar3 = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)s);
    return &puVar3->s;
  }
  if ((us_socket_context_t *)s->prev != s->context) {
    us_internal_socket_context_unlink(s->context,s);
    us_poll_stop(&s->p,s->context->loop);
    __fd = us_poll_fd(&s->p);
    close(__fd);
    puVar1 = s->context;
    puVar2 = puVar1->loop;
    s->next = (puVar2->data).closed_head;
    (puVar2->data).closed_head = s;
    s->prev = (us_socket_t *)puVar1;
    puVar4 = (*puVar1->on_close)(s);
    return puVar4;
  }
  return s;
}

Assistant:

struct us_socket_t *us_socket_close(int ssl, struct us_socket_t *s) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_close((struct us_internal_ssl_socket_t *) s);
    }
#endif

    if (!us_socket_is_closed(0, s)) {
        us_internal_socket_context_unlink(s->context, s);
        us_poll_stop((struct us_poll_t *) s, s->context->loop);
        bsd_close_socket(us_poll_fd((struct us_poll_t *) s));

        /* Link this socket to the close-list and let it be deleted after this iteration */
        s->next = s->context->loop->data.closed_head;
        s->context->loop->data.closed_head = s;

        /* Any socket with prev = context is marked as closed */
        s->prev = (struct us_socket_t *) s->context;

        return s->context->on_close(s);
    }
    return s;
}